

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

void compute_rnn(RNNState *rnn,float *gains,float *vad,float *input)

{
  int iVar1;
  int iVar2;
  RNNModel *pRVar3;
  long lVar4;
  float dense_out [128];
  float denoise_input [384];
  float noise_input [384];
  float afStack_e38 [128];
  float local_c38 [384];
  float local_638 [386];
  
  pRVar3 = rnn->model;
  compute_dense(pRVar3->input_dense,afStack_e38,input);
  compute_gru(pRVar3->vad_gru,rnn->vad_gru_state,afStack_e38);
  compute_dense(rnn->model->vad_output,vad,rnn->vad_gru_state);
  pRVar3 = rnn->model;
  iVar1 = pRVar3->input_dense_size;
  lVar4 = (long)iVar1;
  if (0 < lVar4) {
    memcpy(local_638,afStack_e38,lVar4 * 4);
  }
  iVar2 = pRVar3->vad_gru_size;
  if (0 < (long)iVar2) {
    memcpy(local_638 + lVar4,rnn->vad_gru_state,(long)iVar2 * 4);
  }
  lVar4 = 0;
  do {
    local_638[(int)lVar4 + iVar2 + iVar1] = input[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x2a);
  compute_gru(pRVar3->noise_gru,rnn->noise_gru_state,local_638);
  pRVar3 = rnn->model;
  iVar1 = pRVar3->vad_gru_size;
  lVar4 = (long)iVar1;
  if (0 < lVar4) {
    memcpy(local_c38,rnn->vad_gru_state,lVar4 * 4);
  }
  iVar2 = pRVar3->noise_gru_size;
  if (0 < (long)iVar2) {
    memcpy(local_c38 + lVar4,rnn->noise_gru_state,(long)iVar2 * 4);
  }
  lVar4 = 0;
  do {
    local_c38[(int)lVar4 + iVar2 + iVar1] = input[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x2a);
  compute_gru(pRVar3->denoise_gru,rnn->denoise_gru_state,local_c38);
  compute_dense(rnn->model->denoise_output,gains,rnn->denoise_gru_state);
  return;
}

Assistant:

void compute_rnn(RNNState *rnn, float *gains, float *vad, const float *input) {
    int i;
    float dense_out[MAX_NEURONS];
    float noise_input[MAX_NEURONS * 3];
    float denoise_input[MAX_NEURONS * 3];

    // 获得 vad output
    compute_dense(rnn->model->input_dense, dense_out, input);
    compute_gru(rnn->model->vad_gru, rnn->vad_gru_state, dense_out);
    compute_dense(rnn->model->vad_output, vad, rnn->vad_gru_state);

    // noise_input[0, 24) = dense_out 对应Architecture左侧的Dense tanh(24)
    for (i = 0; i < rnn->model->input_dense_size; i++) noise_input[i] = dense_out[i];
    for (i = 0; i < rnn->model->vad_gru_size; i++)
        noise_input[i + rnn->model->input_dense_size] = rnn->vad_gru_state[i];
    for (i = 0; i < INPUT_SIZE; i++)
        noise_input[i + rnn->model->input_dense_size + rnn->model->vad_gru_size] = input[i];
    compute_gru(rnn->model->noise_gru, rnn->noise_gru_state, noise_input);

    for (i = 0; i < rnn->model->vad_gru_size; i++) denoise_input[i] = rnn->vad_gru_state[i];
    for (i = 0; i < rnn->model->noise_gru_size; i++)
        denoise_input[i + rnn->model->vad_gru_size] = rnn->noise_gru_state[i];
    for (i = 0; i < INPUT_SIZE; i++)
        denoise_input[i + rnn->model->vad_gru_size + rnn->model->noise_gru_size] = input[i];
    compute_gru(rnn->model->denoise_gru, rnn->denoise_gru_state, denoise_input);
    compute_dense(rnn->model->denoise_output, gains, rnn->denoise_gru_state);
}